

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBorderClampTest::verifyTextureCompareResult
          (TextureBorderClampTest *this,ConstPixelBufferAccess *renderedFrame,float *texCoord,
          ReferenceParams *samplerParams,TexComparePrecision *texComparePrecision,
          TexComparePrecision *lowQualityTexComparePrecision,LodPrecision *lodPrecision,
          LodPrecision *lowQualityLodPrecision)

{
  pointer *this_00;
  int iVar1;
  int iVar2;
  qpTestResult qVar3;
  RenderTarget *this_01;
  PixelFormat *pPVar4;
  Texture2D *this_02;
  Texture2D *this_03;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  bool bVar7;
  Texture2DView TVar8;
  allocator<char> local_9c9;
  string local_9c8;
  allocator<char> local_9a1;
  string local_9a0;
  LogImage local_980;
  allocator<char> local_8e9;
  string local_8e8;
  allocator<char> local_8c1;
  string local_8c0;
  LogImage local_8a0;
  allocator<char> local_809;
  string local_808;
  allocator<char> local_7e1;
  string local_7e0;
  LogImage local_7c0;
  allocator<char> local_729;
  string local_728;
  allocator<char> local_701;
  string local_700;
  LogImageSet local_6e0;
  MessageBuilder local_6a0;
  allocator<char> local_519;
  string local_518;
  MessageBuilder local_4f8;
  PixelBufferAccess local_378;
  ConstPixelBufferAccess local_350;
  MessageBuilder local_328;
  PixelBufferAccess local_1a8;
  ConstPixelBufferAccess local_180;
  SurfaceAccess local_158;
  int local_134;
  undefined1 local_130 [4];
  int numFailedPixels;
  Surface errorMask;
  Surface reference;
  Texture2DView local_f0;
  undefined1 local_e0 [8];
  Texture2DView effectiveView;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  undefined1 local_a8 [8];
  Vec3 nonShadowThreshold;
  Vector<int,_4> local_8c;
  TextureTestUtil local_7c [16];
  tcu local_6c [16];
  tcu local_5c [8];
  IVec4 nonShadowBits;
  int colorErrorBits;
  PixelFormat pixelFormat;
  TexComparePrecision *lowQualityTexComparePrecision_local;
  TexComparePrecision *texComparePrecision_local;
  ReferenceParams *samplerParams_local;
  float *texCoord_local;
  ConstPixelBufferAccess *renderedFrame_local;
  TextureBorderClampTest *this_local;
  
  this_01 = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
  pPVar4 = tcu::RenderTarget::getPixelFormat(this_01);
  nonShadowBits.m_data[3] = pPVar4->redBits;
  unique0x1000077c = pPVar4->greenBits;
  nonShadowBits.m_data[2] = 1;
  glu::TextureTestUtil::getBitsVec(local_7c,(PixelFormat *)(nonShadowBits.m_data + 3));
  tcu::Vector<int,_4>::Vector(&local_8c,1);
  tcu::operator-(local_6c,(Vector<int,_4> *)local_7c,&local_8c);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(nonShadowThreshold.m_data + 1),0);
  tcu::max<int,4>(local_5c,(Vector<int,_4> *)local_6c,
                  (Vector<int,_4> *)(nonShadowThreshold.m_data + 1));
  this_00 = &srcLevelStorage.
             super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  tcu::computeFixedPointThreshold((tcu *)this_00,(IVec4 *)local_5c);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_a8,(int)this_00,1,2);
  std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::vector
            ((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
             &effectiveView.m_levels);
  this_02 = de::details::UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>::operator->
                      (&(this->m_texture).
                        super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>);
  this_03 = glu::Texture2D::getRefTexture(this_02);
  TVar8 = tcu::Texture2D::operator_cast_to_Texture2DView(this_03);
  local_f0.m_levels = TVar8.m_levels;
  local_f0.m_numLevels = TVar8.m_numLevels;
  TVar8 = tcu::getEffectiveTextureView
                    (&local_f0,
                     (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                      *)&effectiveView.m_levels,&samplerParams->sampler);
  effectiveView._0_8_ = TVar8.m_levels;
  local_e0._0_4_ = TVar8.m_numLevels;
  iVar1 = tcu::ConstPixelBufferAccess::getWidth(renderedFrame);
  iVar2 = tcu::ConstPixelBufferAccess::getHeight(renderedFrame);
  tcu::Surface::Surface((Surface *)&errorMask.m_pixels.m_cap,iVar1,iVar2);
  iVar1 = tcu::ConstPixelBufferAccess::getWidth(renderedFrame);
  iVar2 = tcu::ConstPixelBufferAccess::getHeight(renderedFrame);
  tcu::Surface::Surface((Surface *)local_130,iVar1,iVar2);
  tcu::SurfaceAccess::SurfaceAccess
            (&local_158,(Surface *)&errorMask.m_pixels.m_cap,
             (PixelFormat *)(nonShadowBits.m_data + 3));
  glu::TextureTestUtil::sampleTexture(&local_158,(Texture2DView *)local_e0,texCoord,samplerParams);
  tcu::Surface::getAccess((PixelBufferAccess *)&local_180,(Surface *)&errorMask.m_pixels.m_cap);
  tcu::Surface::getAccess(&local_1a8,(Surface *)local_130);
  local_134 = glu::TextureTestUtil::computeTextureCompareDiff
                        (renderedFrame,&local_180,&local_1a8,(Texture2DView *)local_e0,texCoord,
                         samplerParams,texComparePrecision,lodPrecision,(Vec3 *)local_a8);
  if (0 < local_134) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_328,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_328,
                        (char (*) [66])
                        "Warning: Verification assuming high-quality PCF filtering failed.");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_328);
    tcu::Surface::getAccess((PixelBufferAccess *)&local_350,(Surface *)&errorMask.m_pixels.m_cap);
    tcu::Surface::getAccess(&local_378,(Surface *)local_130);
    local_134 = glu::TextureTestUtil::computeTextureCompareDiff
                          (renderedFrame,&local_350,&local_378,(Texture2DView *)local_e0,texCoord,
                           samplerParams,lowQualityTexComparePrecision,lowQualityLodPrecision,
                           (Vec3 *)local_a8);
    if (local_134 < 1) {
      qVar3 = tcu::TestContext::getTestResult
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      if (qVar3 == QP_TEST_RESULT_PASS) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_518,"Low-quality result",&local_519);
        tcu::ResultCollector::addResult(&this->m_result,QP_TEST_RESULT_QUALITY_WARNING,&local_518);
        std::__cxx11::string::~string((string *)&local_518);
        std::allocator<char>::~allocator(&local_519);
      }
    }
    else {
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_4f8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (&local_4f8,
                          (char (*) [82])
                          "ERROR: Verification against low precision requirements failed, failing test case."
                         );
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_4f8);
    }
  }
  if (0 < local_134) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_6a0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_6a0,(char (*) [40])"ERROR: Result verification failed, got ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_134);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [17])" invalid pixels!");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_6a0);
  }
  pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_700,"VerifyResult",&local_701)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_728,"Verification result",&local_729);
  tcu::LogImageSet::LogImageSet(&local_6e0,&local_700,&local_728);
  pTVar5 = tcu::TestLog::operator<<(pTVar5,&local_6e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7e0,"Rendered",&local_7e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_808,"Rendered image",&local_809);
  tcu::LogImage::LogImage
            (&local_7c0,&local_7e0,&local_808,renderedFrame,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::TestLog::operator<<(pTVar5,&local_7c0);
  tcu::LogImage::~LogImage(&local_7c0);
  std::__cxx11::string::~string((string *)&local_808);
  std::allocator<char>::~allocator(&local_809);
  std::__cxx11::string::~string((string *)&local_7e0);
  std::allocator<char>::~allocator(&local_7e1);
  tcu::LogImageSet::~LogImageSet(&local_6e0);
  std::__cxx11::string::~string((string *)&local_728);
  std::allocator<char>::~allocator(&local_729);
  std::__cxx11::string::~string((string *)&local_700);
  std::allocator<char>::~allocator(&local_701);
  if (0 < local_134) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c0,"Reference",&local_8c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8e8,"Ideal reference image",&local_8e9);
    tcu::LogImage::LogImage
              (&local_8a0,&local_8c0,&local_8e8,(Surface *)&errorMask.m_pixels.m_cap,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar5 = tcu::TestLog::operator<<(pTVar5,&local_8a0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_9a0,"ErrorMask",&local_9a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_9c8,"Error mask",&local_9c9)
    ;
    tcu::LogImage::LogImage
              (&local_980,&local_9a0,&local_9c8,(Surface *)local_130,QP_IMAGE_COMPRESSION_MODE_BEST)
    ;
    tcu::TestLog::operator<<(pTVar5,&local_980);
    tcu::LogImage::~LogImage(&local_980);
    std::__cxx11::string::~string((string *)&local_9c8);
    std::allocator<char>::~allocator(&local_9c9);
    std::__cxx11::string::~string((string *)&local_9a0);
    std::allocator<char>::~allocator(&local_9a1);
    tcu::LogImage::~LogImage(&local_8a0);
    std::__cxx11::string::~string((string *)&local_8e8);
    std::allocator<char>::~allocator(&local_8e9);
    std::__cxx11::string::~string((string *)&local_8c0);
    std::allocator<char>::~allocator(&local_8c1);
  }
  pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(pTVar5,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
  bVar7 = local_134 == 0;
  tcu::Surface::~Surface((Surface *)local_130);
  tcu::Surface::~Surface((Surface *)&errorMask.m_pixels.m_cap);
  std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::~vector
            ((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
             &effectiveView.m_levels);
  return bVar7;
}

Assistant:

bool TextureBorderClampTest::verifyTextureCompareResult (const tcu::ConstPixelBufferAccess&				renderedFrame,
														 const float*									texCoord,
														 const glu::TextureTestUtil::ReferenceParams&	samplerParams,
													     const tcu::TexComparePrecision&				texComparePrecision,
													     const tcu::TexComparePrecision&				lowQualityTexComparePrecision,
														 const tcu::LodPrecision&						lodPrecision,
														 const tcu::LodPrecision&						lowQualityLodPrecision)
{
	const tcu::PixelFormat						pixelFormat				= m_context.getRenderTarget().getPixelFormat();
	const int									colorErrorBits			= 1;
	const tcu::IVec4							nonShadowBits			= tcu::max(glu::TextureTestUtil::getBitsVec(pixelFormat) - tcu::IVec4(colorErrorBits), tcu::IVec4(0));
	const tcu::Vec3								nonShadowThreshold		= tcu::computeFixedPointThreshold(nonShadowBits).swizzle(1,2,3);
	std::vector<tcu::ConstPixelBufferAccess>	srcLevelStorage;
	const tcu::Texture2DView					effectiveView			= tcu::getEffectiveTextureView(m_texture->getRefTexture(), srcLevelStorage, samplerParams.sampler);
	tcu::Surface								reference				(renderedFrame.getWidth(), renderedFrame.getHeight());
	tcu::Surface								errorMask				(renderedFrame.getWidth(), renderedFrame.getHeight());
	int											numFailedPixels;

	glu::TextureTestUtil::sampleTexture(tcu::SurfaceAccess(reference, pixelFormat), effectiveView, texCoord, samplerParams);

	numFailedPixels = glu::TextureTestUtil::computeTextureCompareDiff(renderedFrame, reference.getAccess(), errorMask.getAccess(), effectiveView,
																	  texCoord, samplerParams, texComparePrecision, lodPrecision, nonShadowThreshold);

	if (numFailedPixels > 0)
	{
		m_testCtx.getLog()	<< tcu::TestLog::Message
							<< "Warning: Verification assuming high-quality PCF filtering failed."
							<< tcu::TestLog::EndMessage;

		numFailedPixels = glu::TextureTestUtil::computeTextureCompareDiff(renderedFrame, reference.getAccess(), errorMask.getAccess(), effectiveView,
																		  texCoord, samplerParams, lowQualityTexComparePrecision, lowQualityLodPrecision, nonShadowThreshold);

		if (numFailedPixels > 0)
			m_testCtx.getLog() << tcu::TestLog::Message << "ERROR: Verification against low precision requirements failed, failing test case." << tcu::TestLog::EndMessage;
		else if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			m_result.addResult(QP_TEST_RESULT_QUALITY_WARNING, "Low-quality result");
	}

	if (numFailedPixels > 0)
		m_testCtx.getLog() << tcu::TestLog::Message << "ERROR: Result verification failed, got " << numFailedPixels << " invalid pixels!" << tcu::TestLog::EndMessage;
	m_testCtx.getLog()	<< tcu::TestLog::ImageSet("VerifyResult", "Verification result")
						<< tcu::TestLog::Image("Rendered", "Rendered image", renderedFrame);
	if (numFailedPixels > 0)
	{
		m_testCtx.getLog()	<< tcu::TestLog::Image("Reference", "Ideal reference image", reference)
							<< tcu::TestLog::Image("ErrorMask", "Error mask", errorMask);
	}
	m_testCtx.getLog() << tcu::TestLog::EndImageSet;

	return (numFailedPixels == 0);
}